

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

container_t * container_range_of_ones(uint32_t range_start,uint32_t range_end,uint8_t *result_type)

{
  array_container_t *paVar1;
  run_container_t *prVar2;
  
  if (range_end < range_start) {
    __assert_fail("range_end >= range_start",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x1131,"container_t *container_range_of_ones(uint32_t, uint32_t, uint8_t *)");
  }
  if ((range_end - range_start) + 1 < 3) {
    *result_type = '\x02';
    paVar1 = array_container_create_range(range_start,range_end);
    return paVar1;
  }
  *result_type = '\x03';
  prVar2 = run_container_create_range(range_start,range_end);
  return prVar2;
}

Assistant:

static inline container_t *container_range_of_ones(
    uint32_t range_start, uint32_t range_end,
    uint8_t *result_type
){
    assert(range_end >= range_start);
    uint64_t cardinality =  range_end - range_start + 1;
    if(cardinality <= 2) {
      *result_type = ARRAY_CONTAINER_TYPE;
      return array_container_create_range(range_start, range_end);
    } else {
      *result_type = RUN_CONTAINER_TYPE;
      return run_container_create_range(range_start, range_end);
    }
}